

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O3

void tcg_out_qemu_st(TCGContext_conflict9 *s,TCGArg *args,_Bool is64)

{
  TCGReg arg;
  TCGReg addrlo;
  TCGReg oi;
  tcg_insn_unit *ptVar1;
  byte *pbVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined7 in_register_00000011;
  uint mem_index;
  TCGReg TVar5;
  uint opc;
  int in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  tcg_insn_unit *label_ptr [2];
  
  uVar4 = (undefined4)CONCAT71(in_register_00000011,is64);
  arg = (TCGReg)*args;
  addrlo = *(TCGReg *)(args + 1);
  oi = *(TCGReg *)(args + 2);
  mem_index = oi >> 4;
  tcg_out_tlb_load(s,addrlo,oi & TCG_REG_R15,mem_index,(MemOp)label_ptr,(tcg_insn_unit **)0x4,
                   in_stack_ffffffffffffffa8);
  uVar3 = 0;
  if (have_movbe == false) {
    uVar3 = mem_index & 8;
  }
  opc = 0x2f1;
  if (have_movbe == false) {
    opc = 0x89;
  }
  if ((mem_index & 8) == 0) {
    opc = 0x89;
  }
  TVar5 = arg;
  switch(mem_index & 3) {
  case 0:
    uVar3 = arg >> 1 & 4;
    if (3 < (int)arg || uVar3 != 0) {
      pbVar2 = s->code_ptr;
      s->code_ptr = pbVar2 + 1;
      *pbVar2 = (byte)uVar3 | 0x40;
    }
    ptVar1 = s->code_ptr;
    s->code_ptr = ptVar1 + 1;
    *ptVar1 = 0x88;
    goto LAB_00d070ed;
  case 1:
    if (uVar3 != 0) {
      TVar5 = TCG_REG_EDI;
      tcg_out_mov(s,TCG_TYPE_I32,TCG_REG_EDI,arg);
      ptVar1 = s->code_ptr;
      s->code_ptr = ptVar1 + 1;
      *ptVar1 = 'f';
      ptVar1 = s->code_ptr;
      s->code_ptr = ptVar1 + 1;
      *ptVar1 = 0xc1;
      ptVar1 = s->code_ptr;
      s->code_ptr = ptVar1 + 1;
      *ptVar1 = 199;
      ptVar1 = s->code_ptr;
      s->code_ptr = ptVar1 + 1;
      *ptVar1 = '\b';
    }
    opc = opc | 0x400;
    break;
  case 2:
    if (uVar3 != 0) {
      TVar5 = TCG_REG_EDI;
      tcg_out_mov(s,TCG_TYPE_I32,TCG_REG_EDI,arg);
      ptVar1 = s->code_ptr;
      s->code_ptr = ptVar1 + 1;
      *ptVar1 = '\x0f';
      ptVar1 = s->code_ptr;
      s->code_ptr = ptVar1 + 1;
      *ptVar1 = 0xcf;
    }
    break;
  case 3:
    if (uVar3 != 0) {
      TVar5 = TCG_REG_EDI;
      tcg_out_mov(s,TCG_TYPE_I64,TCG_REG_EDI,arg);
      ptVar1 = s->code_ptr;
      s->code_ptr = ptVar1 + 1;
      *ptVar1 = 'H';
      ptVar1 = s->code_ptr;
      s->code_ptr = ptVar1 + 1;
      *ptVar1 = '\x0f';
      ptVar1 = s->code_ptr;
      s->code_ptr = ptVar1 + 1;
      *ptVar1 = 0xcf;
    }
    opc = opc | 0x1000;
  }
  tcg_out_opc(s,opc,TVar5,6,0);
LAB_00d070ed:
  pbVar2 = s->code_ptr;
  s->code_ptr = pbVar2 + 1;
  *pbVar2 = ((byte)TVar5 & 7) << 3 | 6;
  add_qemu_ldst_label(s,false,SUB41(uVar4,0),oi,arg,addrlo,(TCGReg)s->code_ptr,(TCGReg)label_ptr,
                      (tcg_insn_unit *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                      ,(tcg_insn_unit **)CONCAT44(uVar4,in_stack_ffffffffffffffb0));
  return;
}

Assistant:

static void tcg_out_qemu_st(TCGContext *s, const TCGArg *args, bool is64)
{
    TCGReg datalo, datahi, addrlo;
    TCGReg addrhi QEMU_UNUSED_VAR;
    TCGMemOpIdx oi;
    MemOp opc;
    int mem_index;
    tcg_insn_unit *label_ptr[2];

    datalo = *args++;
    datahi = (TCG_TARGET_REG_BITS == 32 && is64 ? *args++ : 0);
    addrlo = *args++;
    addrhi = (TARGET_LONG_BITS > TCG_TARGET_REG_BITS ? *args++ : 0);
    oi = *args++;
    opc = get_memop(oi);

    mem_index = get_mmuidx(oi);

    tcg_out_tlb_load(s, addrlo, addrhi, mem_index, opc,
                     label_ptr, offsetof(CPUTLBEntry, addr_write));

    /* TLB Hit.  */
    tcg_out_qemu_st_direct(s, datalo, datahi, TCG_REG_L1, -1, 0, 0, opc);

    /* Record the current context of a store into ldst label */
    add_qemu_ldst_label(s, false, is64, oi, datalo, datahi, addrlo, addrhi,
                        s->code_ptr, label_ptr);
}